

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS
ref_cell_list_with2(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_INT max_cell,REF_INT *ncell,
                   REF_INT *cell_list)

{
  int iVar1;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  int iVar5;
  long lVar6;
  REF_INT RVar7;
  long lVar8;
  
  *ncell = 0;
  if (((-1 < node0) && (pRVar2 = ref_cell->ref_adj, node0 < pRVar2->nnode)) &&
     (lVar6 = (long)pRVar2->first[(uint)node0], lVar6 != -1)) {
    pRVar4 = pRVar2->item + lVar6;
    RVar7 = ref_cell->node_per;
    iVar5 = 0;
    while( true ) {
      if (0 < RVar7) {
        iVar1 = pRVar4->ref;
        pRVar3 = ref_cell->c2n;
        lVar8 = 0;
        do {
          if (pRVar3[(long)ref_cell->size_per * (long)iVar1 + lVar8] == node1) {
            if (max_cell <= iVar5) {
              return 7;
            }
            cell_list[iVar5] = iVar1;
            iVar5 = *ncell + 1;
            *ncell = iVar5;
            RVar7 = ref_cell->node_per;
          }
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 < RVar7);
      }
      pRVar4 = ref_cell->ref_adj->item;
      lVar6 = (long)pRVar4[(int)lVar6].next;
      if (lVar6 == -1) break;
      pRVar4 = pRVar4 + lVar6;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_list_with2(REF_CELL ref_cell, REF_INT node0,
                                       REF_INT node1, REF_INT max_cell,
                                       REF_INT *ncell, REF_INT *cell_list) {
  REF_INT cell, item, cell_node;

  *ncell = 0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    if (*ncell >= max_cell) return REF_INCREASE_LIMIT;
    cell_list[*ncell] = cell;
    (*ncell)++;
  }

  return REF_SUCCESS;
}